

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall tonk::SessionIncoming::PostAcknowledgements(SessionIncoming *this)

{
  string *desc;
  long in_RSI;
  ErrorResult *in_RDI;
  int ackResult;
  uint ackBufferBytes;
  BandwidthShape shape;
  uint8_t data [1330];
  uint *in_stack_fffffffffffff9d0;
  SessionIncoming *in_stack_fffffffffffff9d8;
  ErrorResult *pEVar1;
  BandwidthShape *in_stack_fffffffffffff9e0;
  SiameseDecoder in_stack_fffffffffffff9e8;
  allocator *source;
  ErrorResult *this_00;
  allocator local_5d9;
  string local_5d8 [32];
  SiameseResult local_5b8;
  int local_5b4;
  undefined8 local_5b0;
  ErrorResult local_5a8 [24];
  long local_50;
  undefined4 local_44;
  string *local_40;
  char *local_38;
  uint32_t local_24;
  ErrorResult *local_20;
  long local_18;
  undefined8 local_10;
  long local_8;
  
  if (*(int *)(in_RSI + 0x274) == *(int *)(in_RSI + 0x270)) {
    Result::Success();
  }
  else {
    this_00 = local_5a8;
    local_24 = GetNextExpectedNonce24(in_stack_fffffffffffff9d8);
    local_20 = this_00;
    *(uint32_t *)&this_00->Source = local_24;
    local_18 = *(long *)(in_RSI + 0x20);
    local_5b0 = *(undefined8 *)(local_18 + 0xa0);
    local_10 = local_5b0;
    BandwidthShape::Compress(in_stack_fffffffffffff9e0,(uint8_t *)in_stack_fffffffffffff9d8);
    local_5b4 = 0;
    local_5b8 = siamese_decoder_ack(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                                    (uint)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                                    in_stack_fffffffffffff9d0);
    if ((local_5b8 == Siamese_NeedMoreData) || (local_5b8 == Siamese_Success)) {
      local_8 = *(long *)(in_RSI + 0x20);
      *(undefined1 *)(local_8 + 0xa8) = 0;
      (**(code **)(**(long **)(in_RSI + 0x18) + 0x10))
                (in_RDI,*(long **)(in_RSI + 0x18),1,local_5a8,local_5b4 + 6);
    }
    else {
      source = &local_5d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,"siamese_decoder_ack failed",source);
      local_50 = (long)(int)local_5b8;
      local_38 = "SessionIncoming::PostAcknowledgements";
      local_40 = local_5d8;
      local_44 = 1;
      pEVar1 = in_RDI;
      desc = (string *)operator_new(0x38);
      ErrorResult::ErrorResult
                (this_00,(char *)source,desc,(ErrorType)((ulong)pEVar1 >> 0x20),
                 (ErrorCodeT)in_stack_fffffffffffff9d0);
      pEVar1->Source = (char *)desc;
      std::__cxx11::string::~string(local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    }
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionIncoming::PostAcknowledgements()
{
    //AckRequired = false;

    // Check if the receiver has already got this ack
    if (LastAckAckSeq == FECNextExpectedPacketNum) {
        return Result::Success();
    }

    // Generate decoder ack data
    uint8_t data[protocol::kMinPossibleDatagramByteLimit];

    // Write NextExpectedNonce to the front (truncated)
    siamese::WriteU24_LE_Min4Bytes(data, GetNextExpectedNonce24());

    // Calculate sender shape to deliver to remote peer
    const BandwidthShape shape = Deps.ReceiverControl->GetSenderShape();
    shape.Compress(data + 3);

    // Append acknowledgement data
    unsigned ackBufferBytes = 0;
    const int ackResult = siamese_decoder_ack(
        FECDecoder,
        data + kAckOverheadBytes,
        protocol::kMinPossibleDatagramByteLimit - kAckOverheadBytes,
        &ackBufferBytes);

    if (ackResult == Siamese_NeedMoreData) {
        // No datagrams received yet
        TONK_DEBUG_ASSERT(ackBufferBytes == 0);
    }
    else if (ackResult != Siamese_Success) {
        return Result("SessionIncoming::PostAcknowledgements", "siamese_decoder_ack failed", ErrorType::Siamese, ackResult);
    }

    // Let the bandwidth control subsystem know we sent an ack
    Deps.ReceiverControl->OnSendAck();

    return Deps.Outgoing->QueueUnreliable(
        protocol::MessageType_Acknowledgements,
        data,
        kAckOverheadBytes + ackBufferBytes);
}